

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

Value __thiscall
MiniScript::Parser::ParseSeqLookup(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  LexerStorage *pLVar1;
  long lVar2;
  ParseState *pPVar3;
  undefined3 uVar4;
  undefined4 uVar5;
  undefined7 in_register_00000011;
  Lexer *this_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  Parser *pPVar6;
  Parser *this_01;
  char in_R8B;
  Value VVar7;
  Value temp;
  Value index2;
  Lexer local_2b0;
  Lexer local_2a8;
  Value index2_1;
  Lexer local_288;
  Value local_280;
  Value local_270;
  Value local_260;
  Lexer local_250;
  Lexer local_248;
  Value local_240;
  Value local_230;
  Value local_220;
  String local_210;
  Value local_200;
  Value local_1f0;
  Value local_1e0;
  Value local_1d0;
  List<MiniScript::TACLine> local_1c0;
  Value local_1b0;
  Value local_1a0;
  List<MiniScript::TACLine> local_190;
  Value local_180;
  Token local_170;
  Token local_150;
  Token local_130;
  Token local_110;
  TACLine local_f0;
  TACLine local_90;
  
  this_00 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_2a8.ls = this_00->ls;
  if (local_2a8.ls != (LexerStorage *)0x0) {
    (local_2a8.ls)->refCount = (local_2a8.ls)->refCount + 1;
  }
  ParseMap(this,tokens,SUB81(&local_2a8,0),statementStart);
  Lexer::release(&local_2a8);
  while( true ) {
    Lexer::Peek((Token *)&index2,this_00);
    uVar5 = index2._0_4_;
    String::~String((String *)&index2.data);
    if (uVar5 != 0x1a) break;
    Lexer::Dequeue(&local_110,this_00);
    String::~String(&local_110.text);
    Value::Value(&local_180,(Value *)this);
    FullyEvaluate((Parser *)&index2,(Value *)tokens,(LocalOnlyMode)&local_180);
    Value::operator=((Value *)this,&index2);
    Value::~Value(&index2);
    Value::~Value(&local_180);
    Lexer::Peek((Token *)&index2,this_00);
    uVar5 = index2._0_4_;
    String::~String((String *)&index2.data);
    if (uVar5 == 0x21) {
      Lexer::Dequeue(&local_130,this_00);
      String::~String(&local_130.text);
      local_248.ls = this_00->ls;
      if (local_248.ls != (LexerStorage *)0x0) {
        (local_248.ls)->refCount = (local_248.ls)->refCount + 1;
      }
      ParseExpr((Parser *)&index2,tokens,SUB81(&local_248,0),false);
      Lexer::release(&local_248);
      pLVar1 = tokens[6].ls;
      temp.data.tempNum = *(undefined4 *)&(pLVar1->pending).ls;
      *(int *)&(pLVar1->pending).ls = temp.data.tempNum + 1;
      temp.type = Temp;
      temp.noInvoke = false;
      temp.localOnly = Off;
      List<MiniScript::TACLine>::List(&local_190,(List<MiniScript::TACLine> *)pLVar1);
      Value::Value(&local_1a0,(Value *)this);
      Value::Value(&local_1b0,(Value *)Value::null);
      uVar5 = index2._0_4_;
      local_220.type = index2.type;
      local_220.noInvoke = index2.noInvoke;
      local_220.localOnly = index2.localOnly;
      local_220.data._4_4_ = index2.data._4_4_;
      local_220.data.tempNum = index2.data.tempNum;
      if (local_220.data.ref != (RefCountedStorage *)0x0 && Temp < index2.type) {
        (local_220.data.ref)->refCount = (local_220.data.ref)->refCount + 1;
      }
      index2._0_4_ = uVar5;
      Intrinsics::CompileSlice(&local_190,&local_1a0,&local_1b0,&local_220,temp.data.tempNum);
      Value::~Value(&local_220);
      Value::~Value(&local_1b0);
      Value::~Value(&local_1a0);
      List<MiniScript::TACLine>::release(&local_190);
      Value::operator=((Value *)this,&temp);
      Value::~Value(&temp);
      this_01 = (Parser *)&index2;
    }
    else {
      local_250.ls = this_00->ls;
      if (local_250.ls != (LexerStorage *)0x0) {
        (local_250.ls)->refCount = (local_250.ls)->refCount + 1;
      }
      ParseExpr((Parser *)&temp,tokens,SUB81(&local_250,0),false);
      Lexer::release(&local_250);
      Lexer::Peek((Token *)&index2,this_00);
      uVar5 = index2._0_4_;
      String::~String((String *)&index2.data);
      if (uVar5 == 0x21) {
        Lexer::Dequeue(&local_150,this_00);
        String::~String(&local_150.text);
        Value::Value(&index2_1,(Value *)Value::null);
        Lexer::Peek((Token *)&index2,this_00);
        uVar5 = index2._0_4_;
        String::~String((String *)&index2.data);
        if (uVar5 != 0x1b) {
          local_2b0.ls = this_00->ls;
          if (local_2b0.ls != (LexerStorage *)0x0) {
            (local_2b0.ls)->refCount = (local_2b0.ls)->refCount + 1;
          }
          ParseExpr((Parser *)&index2,tokens,SUB81(&local_2b0,0),false);
          Value::operator=(&index2_1,&index2);
          Value::~Value(&index2);
          Lexer::release(&local_2b0);
        }
        pLVar1 = tokens[6].ls;
        index2.data.tempNum = *(undefined4 *)&(pLVar1->pending).ls;
        *(int *)&(pLVar1->pending).ls = index2.data.tempNum + 1;
        index2.type = Temp;
        index2.noInvoke = false;
        index2.localOnly = Off;
        List<MiniScript::TACLine>::List(&local_1c0,(List<MiniScript::TACLine> *)pLVar1);
        Value::Value(&local_1d0,(Value *)this);
        uVar4 = temp._0_3_;
        local_230.type = temp.type;
        local_230.noInvoke = temp.noInvoke;
        local_230.localOnly = temp.localOnly;
        local_230.data._4_4_ = temp.data._4_4_;
        local_230.data.tempNum = temp.data.tempNum;
        if (local_230.data.ref != (RefCountedStorage *)0x0 && Temp < temp.type) {
          (local_230.data.ref)->refCount = (local_230.data.ref)->refCount + 1;
        }
        local_240.type = index2_1.type;
        local_240.noInvoke = index2_1.noInvoke;
        local_240.localOnly = index2_1.localOnly;
        local_240.data = index2_1.data;
        if (index2_1.data.ref != (RefCountedStorage *)0x0 && Temp < index2_1.type) {
          (index2_1.data.ref)->refCount = (index2_1.data.ref)->refCount + 1;
        }
        temp._0_3_ = uVar4;
        Intrinsics::CompileSlice(&local_1c0,&local_1d0,&local_230,&local_240,index2.data.tempNum);
        Value::~Value(&local_240);
        Value::~Value(&local_230);
        Value::~Value(&local_1d0);
        List<MiniScript::TACLine>::release(&local_1c0);
        Value::operator=((Value *)this,&index2);
        Value::~Value(&index2);
        pPVar6 = (Parser *)&index2_1;
      }
      else {
        pPVar6 = (Parser *)&index2;
        if (in_R8B == '\0') {
          pPVar3 = (ParseState *)tokens[6].ls;
          index2.data.tempNum = pPVar3->nextTempNum;
          pPVar3->nextTempNum = index2.data.tempNum + 1;
          index2.type = Temp;
          index2.noInvoke = false;
          index2.localOnly = Off;
          local_270.type = Temp;
          local_270.noInvoke = false;
          local_270.localOnly = Off;
          local_270.data._4_4_ = index2.data._4_4_;
          local_270.data.tempNum = index2.data.tempNum;
          Value::Value(&local_200,(Value *)this);
          uVar4 = temp._0_3_;
          local_280.type = temp.type;
          local_280.noInvoke = temp.noInvoke;
          local_280.localOnly = temp.localOnly;
          local_280.data._4_4_ = temp.data._4_4_;
          local_280.data.tempNum = temp.data.tempNum;
          if ((StringStorage *)local_280.data.ref != (StringStorage *)0x0 && Temp < temp.type) {
            (local_280.data.ref)->refCount = (local_280.data.ref)->refCount + 1;
          }
          temp._0_3_ = uVar4;
          TACLine::TACLine(&local_f0,&local_270,ElemBofA,&local_200,&local_280);
          ParseState::Add(pPVar3,&local_f0);
          TACLine::~TACLine(&local_f0);
          Value::~Value(&local_280);
          Value::~Value(&local_200);
          Value::~Value(&local_270);
          Value::operator=((Value *)this,&index2);
        }
        else {
          if (*(char *)&(this->errorContext).ss == '\b') {
            lVar2 = *(long *)&(this->errorContext).isTemp;
            pPVar3 = (ParseState *)tokens[6].ls;
            index2.data.tempNum = pPVar3->nextTempNum;
            pPVar3->nextTempNum = index2.data.tempNum + 1;
            index2.type = Temp;
            index2.noInvoke = false;
            index2.localOnly = Off;
            local_260.type = Temp;
            local_260.noInvoke = false;
            local_260.localOnly = Off;
            local_260.data._4_4_ = index2.data._4_4_;
            local_260.data.tempNum = index2.data.tempNum;
            Value::Value(&local_1e0,(Value *)(lVar2 + 0x10));
            Value::Value(&local_1f0,(Value *)(lVar2 + 0x20));
            TACLine::TACLine(&local_90,&local_260,ElemBofA,&local_1e0,&local_1f0);
            ParseState::Add(pPVar3,&local_90);
            TACLine::~TACLine(&local_90);
            Value::~Value(&local_1f0);
            Value::~Value(&local_1e0);
            Value::~Value(&local_260);
            Value::operator=((Value *)this,&index2);
            Value::~Value(&index2);
          }
          Value::SeqElem(&index2,(Value *)this,&temp);
          Value::operator=((Value *)this,&index2);
        }
      }
      this_01 = (Parser *)&temp;
      Value::~Value((Value *)pPVar6);
    }
    Value::~Value((Value *)this_01);
    local_288.ls = this_00->ls;
    if (local_288.ls != (LexerStorage *)0x0) {
      (local_288.ls)->refCount = (local_288.ls)->refCount + 1;
    }
    local_210.ss = (StringStorage *)0x0;
    local_210.isTemp = false;
    RequireToken(&local_170,(Parser *)tokens,&local_288,RSquare,&local_210);
    String::~String(&local_170.text);
    String::~String(&local_210);
    Lexer::release(&local_288);
  }
  VVar7.data.number = extraout_RDX.number;
  VVar7._0_8_ = this;
  return VVar7;
}

Assistant:

Value Parser::ParseSeqLookup(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMap;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);

		while (tokens.Peek().type == Token::Type::LSquare) {
			tokens.Dequeue();	// discard '['
			val = FullyEvaluate(val);

			if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[:4]
				tokens.Dequeue();	// discard ':'
				Value index2 = ParseExpr(tokens);
				Value temp = Value::Temp(output->nextTempNum++);
				Intrinsics::CompileSlice(output->code, val, Value::null, index2, temp.data.tempNum);
				val = temp;
			} else {
				Value index = ParseExpr(tokens);
				if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[2:4] or foo[2:]
					tokens.Dequeue();	// discard ':'
					Value index2 = Value::null;
					if (tokens.Peek().type != Token::Type::RSquare) index2 = ParseExpr(tokens);
					Value temp = Value::Temp(output->nextTempNum++);
					Intrinsics::CompileSlice(output->code, val, index, index2, temp.data.tempNum);
					val = temp;
				} else {			// e.g., foo[3]  (not a slice at all)
					if (statementStart) {
						// At the start of a statement, we don't want to compile the
						// last sequence lookup, because we might have to convert it into
						// an assignment.  But we want to compile any previous one.
						if (val.type == ValueType::SeqElem) {
							SeqElemStorage *vsVal = (SeqElemStorage*)val.data.ref;
							Value temp = Value::Temp(output->nextTempNum++);
							output->Add(TACLine(temp, TACLine::Op::ElemBofA, vsVal->sequence, vsVal->index));
							val = temp;
						}
						val = Value::SeqElem(val, index);
					} else {
						// Anywhere else in an expression, we can compile the lookup right away.
						Value temp = Value::Temp(output->nextTempNum++);
						output->Add(TACLine(temp, TACLine::Op::ElemBofA, val, index));
						val = temp;
					}
				}
			}

			RequireToken(tokens, Token::Type::RSquare);
		}
		return val;
	}